

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O2

int __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldGenerator::GetNumBitsForMessage
          (ImmutableEnumFieldGenerator *this)

{
  bool bVar1;
  
  bVar1 = SupportFieldPresence(this->descriptor_);
  return (int)bVar1;
}

Assistant:

int ImmutableEnumFieldGenerator::GetNumBitsForMessage() const {
  return SupportFieldPresence(descriptor_) ? 1 : 0;
}